

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_write_version(int major,int minor,int transport,uchar *ver)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 1;
  if (minor != 2) {
    iVar3 = minor;
  }
  uVar1 = '\x01' - (uchar)major;
  if (transport != 1) {
    uVar1 = (uchar)major;
  }
  uVar2 = (uint)(byte)-(char)iVar3;
  if (transport != 1) {
    uVar2 = minor;
  }
  *ver = uVar1;
  ver[1] = (uchar)uVar2;
  return;
}

Assistant:

void mbedtls_ssl_write_version( int major, int minor, int transport,
                        unsigned char ver[2] )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( minor == MBEDTLS_SSL_MINOR_VERSION_2 )
            --minor; /* DTLS 1.0 stored as TLS 1.1 internally */

        ver[0] = (unsigned char)( 255 - ( major - 2 ) );
        ver[1] = (unsigned char)( 255 - ( minor - 1 ) );
    }
    else
#else
    ((void) transport);
#endif
    {
        ver[0] = (unsigned char) major;
        ver[1] = (unsigned char) minor;
    }
}